

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

bool __thiscall FButtonStatus::PressKey(FButtonStatus *this,int keynum)

{
  BYTE BVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = keynum & 0x7fff;
  if (uVar4 == 0) {
    this->Keys[0] = 0xffff;
    this->Keys[1] = 0;
    this->Keys[2] = 0;
    this->Keys[3] = 0;
    this->Keys[4] = 0;
    this->Keys[5] = 0;
  }
  else {
    uVar2 = 0xffffffff;
    uVar3 = 5;
    do {
      if (this->Keys[uVar3] == 0) {
        uVar2 = uVar3 & 0xffffffff;
      }
      else if (uVar4 == this->Keys[uVar3]) {
        return false;
      }
      bVar5 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar5);
    if ((int)uVar2 < 0) {
      Printf("More than %u keys pressed for a single action!\n",6);
      return false;
    }
    this->Keys[uVar2] = (WORD)uVar4;
  }
  BVar1 = this->bDown;
  this->bDown = '\x01';
  this->bWentDown = '\x01';
  return BVar1 == '\0';
}

Assistant:

bool FButtonStatus::PressKey (int keynum)
{
	int i, open;

	keynum &= KEY_DBLCLICKED-1;

	if (keynum == 0)
	{ // Issued from console instead of a key, so force on
		Keys[0] = 0xffff;
		for (i = MAX_KEYS-1; i > 0; --i)
		{
			Keys[i] = 0;
		}
	}
	else
	{
		for (i = MAX_KEYS-1, open = -1; i >= 0; --i)
		{
			if (Keys[i] == 0)
			{
				open = i;
			}
			else if (Keys[i] == keynum)
			{ // Key is already down; do nothing
				return false;
			}
		}
		if (open < 0)
		{ // No free key slots, so do nothing
			Printf ("More than %u keys pressed for a single action!\n", MAX_KEYS);
			return false;
		}
		Keys[open] = keynum;
	}
	BYTE wasdown = bDown;
	bDown = bWentDown = true;
	// Returns true if this key caused the button to go down.
	return !wasdown;
}